

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared_context.cpp
# Opt level: O0

SharedMinimizeData * __thiscall
Clasp::SharedContext::Minimize::get(Minimize *this,SharedContext *ctx)

{
  bool bVar1;
  SharedMinimizeData *pSVar2;
  SingleOwnerPtr<Clasp::SharedMinimizeData,_Clasp::ReleaseObject> *in_RDI;
  SharedContext *in_stack_00000040;
  MinimizeBuilder *in_stack_00000048;
  SharedData *in_stack_00000058;
  MinimizeBuilder *in_stack_00000060;
  SharedMinimizeData *in_stack_ffffffffffffffd8;
  undefined8 local_8;
  
  bVar1 = MinimizeBuilder::empty((MinimizeBuilder *)0x1d99dd);
  if (bVar1) {
    local_8 = SingleOwnerPtr<Clasp::SharedMinimizeData,_Clasp::ReleaseObject>::get
                        ((SingleOwnerPtr<Clasp::SharedMinimizeData,_Clasp::ReleaseObject> *)0x1d99f1
                        );
  }
  else {
    pSVar2 = SingleOwnerPtr<Clasp::SharedMinimizeData,_Clasp::ReleaseObject>::get
                       ((SingleOwnerPtr<Clasp::SharedMinimizeData,_Clasp::ReleaseObject> *)0x1d9a06)
    ;
    if (pSVar2 != (SharedMinimizeData *)0x0) {
      SingleOwnerPtr<Clasp::SharedMinimizeData,_Clasp::ReleaseObject>::operator*
                ((SingleOwnerPtr<Clasp::SharedMinimizeData,_Clasp::ReleaseObject> *)0x1d9a1a);
      MinimizeBuilder::add(in_stack_00000060,in_stack_00000058);
      SingleOwnerPtr<Clasp::SharedMinimizeData,_Clasp::ReleaseObject>::operator=
                (in_RDI,in_stack_ffffffffffffffd8);
    }
    MinimizeBuilder::build(in_stack_00000048,in_stack_00000040);
    SingleOwnerPtr<Clasp::SharedMinimizeData,_Clasp::ReleaseObject>::operator=
              (in_RDI,in_stack_ffffffffffffffd8);
    local_8 = SingleOwnerPtr<Clasp::SharedMinimizeData,_Clasp::ReleaseObject>::get
                        ((SingleOwnerPtr<Clasp::SharedMinimizeData,_Clasp::ReleaseObject> *)0x1d9a61
                        );
  }
  return local_8;
}

Assistant:

SharedMinimizeData* get(SharedContext& ctx) {
		if (builder.empty()) { return product.get(); }
		if (product.get()) {
			builder.add(*product);
			product = 0;
		}
		return (product = builder.build(ctx)).get();
	}